

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

bool pop_up_ask_location(Am_Object *sel_widget,bool growing,Am_Object *ref_obj,int *ask_left,
                        int *ask_top,int *ask_width,int *ask_height,int old_width,int old_height)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  ostream *poVar6;
  char *value;
  Am_Inter_Location new_loc;
  Am_Object inter;
  Am_Object loc_ref_obj;
  Am_Value ok;
  bool as_line;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  int *local_40;
  int *local_38;
  
  local_40 = ask_top;
  local_38 = ask_width;
  bVar2 = Am_Object::Valid(ref_obj);
  if (bVar2) {
    pAVar3 = Am_Object::Get(ref_obj,Am_LOCATION_PLACEHOLDER,3);
    Am_Object::Am_Object(&inter,pAVar3);
    bVar2 = Am_Object::Valid(&inter);
    if (!bVar2) {
      Am_Object::Get_Object((Am_Object *)&new_loc,(Am_Slot_Key)sel_widget,0x1df);
      Am_Object::Copy((Am_Object *)&ok,(char *)&new_loc);
      Am_Object::~Am_Object((Am_Object *)&new_loc);
      Am_Object::Create((Am_Object *)&as_line,(char *)&Am_New_Points_Interactor);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&ok);
      pAVar5 = Am_Object::Set((Am_Object *)&as_line,0xdc,pAVar4,0);
      pAVar5 = Am_Object::Set(pAVar5,0xcd,0x6e,0);
      pAVar5 = Am_Object::Set(pAVar5,0xde,done_location_ask_inter.from_wrapper,0);
      Am_Object::Get_Object(&loc_ref_obj,(Am_Slot_Key)pAVar5,0xc5);
      pAVar5 = Am_Object::Set(&loc_ref_obj,0x154,-1,0);
      Am_Object::Get_Owner((Am_Object *)&new_loc,(Am_Slot_Flags)pAVar5);
      Am_Object::operator=(&inter,(Am_Object *)&new_loc);
      Am_Object::~Am_Object((Am_Object *)&new_loc);
      Am_Object::~Am_Object(&loc_ref_obj);
      Am_Object::~Am_Object((Am_Object *)&as_line);
      AVar1 = Am_LOCATION_PLACEHOLDER;
      Am_Object::Am_Object(&local_48,&inter);
      pAVar5 = Am_Object::Add_Part(ref_obj,AVar1,&local_48,0);
      Am_Object::Am_Object(&local_50,(Am_Object *)&ok);
      Am_Object::Add_Part(pAVar5,&local_50,true,0);
      Am_Object::~Am_Object(&local_50);
      Am_Object::~Am_Object(&local_48);
      Am_Object::~Am_Object((Am_Object *)&ok);
    }
    pAVar5 = Am_Object::Set(&inter,0xcc,true,0);
    AVar1 = Am_LOCATION_PLACEHOLDER;
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&am_askclickpos);
    Am_Object::Set(pAVar5,AVar1,pAVar4,1);
    if (growing) {
      pAVar5 = Am_Object::Set(&inter,0xdf,2,0);
      pAVar5 = Am_Object::Set(pAVar5,0xd7,0,0);
      Am_Object::Set(pAVar5,0xd8,0,0);
      value = "Press and drag in the window to define a new position and size";
    }
    else {
      pAVar5 = Am_Object::Set(&inter,0xdf,1,0);
      pAVar5 = Am_Object::Set(pAVar5,0xd7,old_width,0);
      Am_Object::Set(pAVar5,0xd8,old_height,0);
      value = "Click in the window to define a new position";
    }
    Am_Object::Set(&am_askclickpos,0x169,0,0);
    Am_Object::Get_Object((Am_Object *)&ok,0x9188,0x150);
    Am_Object::Set((Am_Object *)&ok,0xab,value,0);
    Am_Object::~Am_Object((Am_Object *)&ok);
    ok.type = 0;
    ok.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Object::Am_Object(&local_58,&am_askclickpos);
    Am_Pop_Up_Window_And_Wait(&local_58,&ok,false);
    Am_Object::~Am_Object(&local_58);
    Am_Object::Set(&inter,0xcc,false,0);
    bVar2 = Am_Value::Valid(&ok);
    if (bVar2) {
      pAVar3 = Am_Object::Get(&am_askclickpos,0x169,0);
      Am_Inter_Location::Am_Inter_Location(&new_loc,pAVar3);
      if (am_sdebug == true) {
        poVar6 = std::operator<<((ostream *)&std::cout,"pop up returned the value ");
        poVar6 = operator<<(poVar6,&new_loc);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::ostream::flush();
      }
      loc_ref_obj.data = (Am_Object_Data *)0x0;
      Am_Object::Am_Object(&local_60,ref_obj);
      Am_Inter_Location::Translate_To(&new_loc,&local_60);
      Am_Object::~Am_Object(&local_60);
      Am_Inter_Location::Get_Location
                (&new_loc,&as_line,&loc_ref_obj,ask_left,local_40,local_38,ask_height);
      Am_Object::~Am_Object(&loc_ref_obj);
      Am_Inter_Location::~Am_Inter_Location(&new_loc);
    }
    Am_Value::~Am_Value(&ok);
    Am_Object::~Am_Object(&inter);
    return bVar2;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar6 = std::operator<<(poVar6,"No ref_object for pop_up_ask_location");
  std::endl<char,std::char_traits<char>>(poVar6);
  Am_Error();
}

Assistant:

bool
pop_up_ask_location(Am_Object &sel_widget, bool growing, Am_Object &ref_obj,
                    int &ask_left, int &ask_top, int &ask_width,
                    int &ask_height, int old_width, int old_height)
{
  if (!ref_obj.Valid()) {
    Am_ERROR("No ref_object for pop_up_ask_location");
  }
  Am_Object inter =
      ref_obj.Get(Am_LOCATION_PLACEHOLDER, Am_RETURN_ZERO_ON_ERROR);
  const char *msg;
  if (!inter.Valid()) {
    Am_Object feedback = sel_widget.Get_Object(Am_RECT_FEEDBACK_OBJECT).Copy();
    inter = Am_New_Points_Interactor.Create()
                .Set(Am_FEEDBACK_OBJECT, feedback)
                .Set(Am_PRIORITY, 110)
                .Set(Am_CREATE_NEW_OBJECT_METHOD, done_location_ask_inter)
                .Get_Object(Am_COMMAND)
                .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                .Get_Owner();
    ref_obj.Add_Part(Am_LOCATION_PLACEHOLDER, inter).Add_Part(feedback);
  }
  inter.Set(Am_ACTIVE, true)
      .Set(Am_LOCATION_PLACEHOLDER, am_askclickpos, Am_OK_IF_NOT_THERE);
  if (growing) {
    inter.Set(Am_HOW_MANY_POINTS, 2)
        .Set(Am_MINIMUM_WIDTH, 0)
        .Set(Am_MINIMUM_HEIGHT, 0);
    msg = "Press and drag in the window to define a new position and size";
  } else {
    inter.Set(Am_HOW_MANY_POINTS, 1)
        .Set(Am_MINIMUM_WIDTH, old_width)
        .Set(Am_MINIMUM_HEIGHT, old_height);
    msg = "Click in the window to define a new position";
  }
  am_askclickpos.Set(Am_VALUE, (0L));
  am_askclickpos.Get_Object(Am_LABEL).Set(Am_TEXT, msg);
  Am_Value ok;

  Am_Pop_Up_Window_And_Wait(am_askclickpos, ok, false);
  inter.Set(Am_ACTIVE, false);
  if (ok.Valid()) {
    Am_Inter_Location new_loc = am_askclickpos.Get(Am_VALUE);
    if (am_sdebug)
      std::cout << "pop up returned the value " << new_loc << std::endl
                << std::flush;
    Am_Object loc_ref_obj;
    bool as_line;
    new_loc.Translate_To(ref_obj);
    new_loc.Get_Location(as_line, loc_ref_obj, ask_left, ask_top, ask_width,
                         ask_height);
    return true;
  } else
    return false;
}